

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_perform(Curl_easy *data)

{
  char *pcVar1;
  int iVar2;
  CURLMcode CVar3;
  Curl_multi *multi;
  timediff_t tVar4;
  CURLMsg *pCVar5;
  int timeout_ms;
  uint uVar6;
  CURLcode CVar7;
  curltime cVar8;
  curltime cVar9;
  curltime newer;
  int still_running;
  sigpipe_ignore pipe_st;
  int local_f0;
  int local_ec;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  sigpipe_ignore local_d0;
  
  if (data == (Curl_easy *)0x0) {
    CVar7 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    pcVar1 = (data->set).errorbuffer;
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    if (data->multi == (Curl_multi *)0x0) {
      multi = data->multi_easy;
      if (multi == (Curl_multi *)0x0) {
        multi = Curl_multi_handle(1,3);
        if (multi == (Curl_multi *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        data->multi_easy = multi;
      }
      CVar7 = CURLE_RECURSIVE_API_CALL;
      if (multi->in_callback == false) {
        curl_multi_setopt(multi,CURLMOPT_MAXCONNECTS,(data->set).maxconnects);
        CVar3 = curl_multi_add_handle(multi,data);
        if (CVar3 == CURLM_OK) {
          local_e8 = 0;
          sigpipe_ignore(data,&local_d0);
          data->multi = multi;
          local_d8 = 0;
          local_e0 = 0;
          do {
            local_ec = 0;
            cVar8 = Curl_now();
            CVar3 = curl_multi_wait(multi,(curl_waitfd *)0x0,0,1000,&local_f0);
            if (CVar3 == CURLM_OK) {
              uVar6 = 0;
              if (local_f0 == 0) {
                cVar9 = Curl_now();
                newer._12_4_ = 0;
                newer.tv_sec = SUB128(cVar9._0_12_,0);
                newer.tv_usec = SUB124(cVar9._0_12_,8);
                cVar9._12_4_ = 0;
                cVar9.tv_sec = SUB128(cVar8._0_12_,0);
                cVar9.tv_usec = SUB124(cVar8._0_12_,8);
                tVar4 = Curl_timediff(newer,cVar9);
                uVar6 = 0;
                if (tVar4 < 0xb) {
                  iVar2 = (int)local_e0;
                  uVar6 = iVar2 + 1;
                  if (1 < iVar2) {
                    timeout_ms = 1 << ((byte)local_e0 & 0x1f);
                    if (8 < iVar2) {
                      timeout_ms = 1000;
                    }
                    Curl_wait_ms(timeout_ms);
                  }
                }
              }
              CVar3 = curl_multi_perform(multi,&local_ec);
              local_e0 = (ulong)uVar6;
            }
            if ((local_ec == 0 && CVar3 == CURLM_OK) &&
               (pCVar5 = curl_multi_info_read(multi,&local_f0), pCVar5 != (CURLMsg *)0x0)) {
              local_e8 = (ulong)(pCVar5->data).result;
              local_d8 = CONCAT71((uint7)(uint3)((pCVar5->data).result >> 8),1);
            }
          } while ((CVar3 == CURLM_OK) && ((local_d8 & 1) == 0));
          CVar7 = (CURLcode)local_e8;
          if (CVar3 != CURLM_OK) {
            CVar7 = (uint)(CVar3 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
          }
          curl_multi_remove_handle(multi,data);
          if (local_d0.no_signal == false) {
            sigaction(0xd,(sigaction *)&local_d0,(sigaction *)0x0);
          }
        }
        else {
          curl_multi_cleanup(multi);
          CVar7 = CURLE_FAILED_INIT;
          if (CVar3 == CURLM_OUT_OF_MEMORY) {
            CVar7 = CURLE_OUT_OF_MEMORY;
          }
        }
      }
    }
    else {
      Curl_failf(data,"easy handle already used in multi handle");
      CVar7 = CURLE_FAILED_INIT;
    }
  }
  return CVar7;
}

Assistant:

static CURLcode easy_perform(struct Curl_easy *data, bool events)
{
  struct Curl_multi *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->set.errorbuffer)
    /* clear this as early as possible */
    data->set.errorbuffer[0] = 0;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  if(multi->in_callback)
    return CURLE_RECURSIVE_API_CALL;

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* assign this after curl_multi_add_handle() since that function checks for
     it and rejects this handle otherwise */
  data->multi = multi;

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}